

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::Image::set_alpha_from_mask_color(Image *this,uint64_t r,uint64_t g,uint64_t b)

{
  long lVar1;
  uint64_t a;
  long lVar2;
  ssize_t x;
  long x_00;
  long y;
  uint64_t sb;
  uint64_t sg;
  uint64_t sr;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  
  y = 0;
  lVar2 = this->width;
  if (this->width < 1) {
    lVar2 = y;
  }
  lVar1 = this->height;
  if (this->height < 1) {
    lVar1 = y;
  }
  for (; y != lVar1; y = y + 1) {
    for (x_00 = 0; lVar2 != x_00; x_00 = x_00 + 1) {
      read_pixel(this,x_00,y,&local_38,&local_40,&local_48,(uint64_t *)0x0);
      if (local_48 == b && (local_40 == g && local_38 == r)) {
        a = 0;
      }
      else {
        a = this->max_value;
      }
      write_pixel(this,x_00,y,local_38,local_40,local_48,a);
    }
  }
  return;
}

Assistant:

void Image::set_alpha_from_mask_color(uint64_t r, uint64_t g, uint64_t b) {
  ssize_t w = this->get_width();
  ssize_t h = this->get_height();
  for (ssize_t y = 0; y < h; y++) {
    for (ssize_t x = 0; x < w; x++) {
      uint64_t sr, sg, sb;
      this->read_pixel(x, y, &sr, &sg, &sb);
      uint64_t a = (sr == r && sg == g && sb == b) ? 0 : this->max_value;
      this->write_pixel(x, y, sr, sg, sb, a);
    }
  }
}